

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)

{
  uchar *puVar1;
  uchar *ipad;
  mbedtls_md_context_t *ctx_local;
  
  if (((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) ||
     (ctx->hmac_ctx == (void *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    puVar1 = (uchar *)ctx->hmac_ctx;
    (*ctx->md_info->starts_func)(ctx->md_ctx);
    (*ctx->md_info->update_func)(ctx->md_ctx,puVar1,(long)ctx->md_info->block_size);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_hmac_reset( mbedtls_md_context_t *ctx )
{
    unsigned char *ipad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    ipad = (unsigned char *) ctx->hmac_ctx;

    ctx->md_info->starts_func( ctx->md_ctx );
    ctx->md_info->update_func( ctx->md_ctx, ipad, ctx->md_info->block_size );

    return( 0 );
}